

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

void __thiscall
HighsHashTable<unsigned_long,_void>::~HighsHashTable(HighsHashTable<unsigned_long,_void> *this)

{
  CLI::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)(this + 8));
  CLI::std::
  unique_ptr<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
  ::~unique_ptr((unique_ptr<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
                 *)this);
  return;
}

Assistant:

~HighsHashTable() {
    if (!std::is_trivially_destructible<Entry>::value && metadata) {
      u64 capacity = tableSizeMask + 1;
      for (u64 i = 0; i < capacity; ++i) {
        if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
    }
  }